

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idastar.hpp
# Opt level: O0

bool __thiscall Idastar<Tiles>::dfs(Idastar<Tiles> *this,State *n,int cost,int pop)

{
  bool bVar1;
  int iVar2;
  int pop_00;
  int iVar3;
  int in_ECX;
  int in_EDX;
  Idastar<Tiles> *in_RSI;
  long in_RDI;
  bool goal;
  Edge<Tiles> e;
  int op;
  int i;
  int nops;
  int f;
  value_type *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  State *in_stack_ffffffffffffffb8;
  Tiles *in_stack_ffffffffffffffc0;
  int local_2c;
  int iVar4;
  bool local_1;
  
  iVar4 = in_EDX;
  iVar2 = Tiles::h(*(Tiles **)(in_RDI + 8),(State *)in_RSI);
  iVar2 = in_EDX + iVar2;
  if ((*(int *)(in_RDI + 0x40) < iVar2) ||
     (bVar1 = Tiles::isgoal(*(Tiles **)(in_RDI + 8),(State *)in_RSI), !bVar1)) {
    if (*(int *)(in_RDI + 0x40) < iVar2) {
      if ((*(int *)(in_RDI + 0x44) < 0) || (iVar2 < *(int *)(in_RDI + 0x44))) {
        *(int *)(in_RDI + 0x44) = iVar2;
      }
      local_1 = false;
    }
    else {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      pop_00 = Tiles::nops(*(Tiles **)(in_RDI + 8),(State *)in_RSI);
      for (local_2c = 0; local_2c < pop_00; local_2c = local_2c + 1) {
        iVar3 = Tiles::nthop(*(Tiles **)(in_RDI + 8),(State *)in_RSI,local_2c);
        if (iVar3 != in_ECX) {
          *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
          Tiles::apply(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4
                      );
          bVar1 = dfs(in_RSI,(State *)CONCAT44(iVar4,in_ECX),iVar2,pop_00);
          Tiles::undo(*(Tiles **)(in_RDI + 8),(State *)in_RSI,
                      (Edge<Tiles> *)&stack0xffffffffffffffa8);
          if (bVar1) {
            std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
                      ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
            return true;
          }
        }
      }
      local_1 = false;
    }
  }
  else {
    std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
              ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dfs(typename D::State &n,  int cost, int pop) {
		int f = cost + this->dom.h(n);

		if (f <= bound && this->dom.isgoal(n)) {
			path.push_back(n);
			return true;
		}

		if (f > bound) {
			if (minoob < 0 || f < minoob)
				minoob = f;
			return false;
		}

		this->expd++;
		int nops = this->dom.nops(n);
		for (int i = 0; i < nops; i++) {
			int op = this->dom.nthop(n, i);
			if (op == pop)
				continue;

			this->gend++;
			Edge<D> e = this->dom.apply(n, op);
			bool goal = dfs(n, e.cost + cost, e.pop);
			this->dom.undo(n, e);
			if (goal) {
				path.push_back(n);
				return true;
			}
		}

		return false;
	}